

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O0

void __thiscall
__gnu_cxx::new_allocator<spdlog::logger>::
construct<spdlog::logger,std::__cxx11::string,std::shared_ptr<spdlog::sinks::ansicolor_stdout_sink<spdlog::details::console_mutex>>>
          (new_allocator<spdlog::logger> *this,logger *__p,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args,
          shared_ptr<spdlog::sinks::ansicolor_stdout_sink<spdlog::details::console_mutex>_>
          *__args_1)

{
  string *in_RDX;
  shared_ptr<spdlog::sinks::ansicolor_stdout_sink<spdlog::details::console_mutex>_> *in_RSI;
  sink_ptr *in_stack_00000020;
  string *in_stack_00000028;
  logger *in_stack_00000030;
  string *this_00;
  string local_40 [64];
  
  this_00 = local_40;
  std::__cxx11::string::string(this_00,in_RDX);
  std::shared_ptr<spdlog::sinks::sink>::
  shared_ptr<spdlog::sinks::ansicolor_stdout_sink<spdlog::details::console_mutex>,void>
            ((shared_ptr<spdlog::sinks::sink> *)this_00,in_RSI);
  spdlog::logger::logger(in_stack_00000030,in_stack_00000028,in_stack_00000020);
  std::shared_ptr<spdlog::sinks::sink>::~shared_ptr((shared_ptr<spdlog::sinks::sink> *)0x2ed038);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

logger(std::string name, It begin, It end)
        : name_(std::move(name))
        , sinks_(begin, end)
    {}